

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void CVodeSensFree(void *cvode_mem)

{
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  
  if (in_RDI != (CVodeMem)0x0) {
    if (in_RDI->cv_SensMallocDone != 0) {
      if (in_RDI->cv_stgr1alloc != 0) {
        free(in_RDI->cv_ncfS1);
        in_RDI->cv_ncfS1 = (int *)0x0;
        free(in_RDI->cv_ncfnS1);
        in_RDI->cv_ncfnS1 = (long *)0x0;
        free(in_RDI->cv_nniS1);
        in_RDI->cv_nniS1 = (long *)0x0;
        free(in_RDI->cv_nnfS1);
        in_RDI->cv_nnfS1 = (long *)0x0;
        in_RDI->cv_stgr1alloc = 0;
      }
      cvSensFreeVectors(in_RDI);
      in_RDI->cv_SensMallocDone = 0;
      in_RDI->cv_sensi = 0;
    }
    if (in_RDI->simMallocDone != 0) {
      N_VDestroy(in_RDI->zn0Sim);
      in_RDI->zn0Sim = (N_Vector)0x0;
      N_VDestroy(in_RDI->ycorSim);
      in_RDI->ycorSim = (N_Vector)0x0;
      N_VDestroy(in_RDI->ewtSim);
      in_RDI->ewtSim = (N_Vector)0x0;
      in_RDI->simMallocDone = 0;
    }
    if (in_RDI->stgMallocDone != 0) {
      N_VDestroy(in_RDI->zn0Stg);
      in_RDI->zn0Stg = (N_Vector)0x0;
      N_VDestroy(in_RDI->ycorStg);
      in_RDI->ycorStg = (N_Vector)0x0;
      N_VDestroy(in_RDI->ewtStg);
      in_RDI->ewtStg = (N_Vector)0x0;
      in_RDI->stgMallocDone = 0;
    }
    if (in_RDI->ownNLSsim != 0) {
      SUNNonlinSolFree(in_RDI->NLSsim);
      in_RDI->ownNLSsim = 0;
      in_RDI->NLSsim = (SUNNonlinearSolver)0x0;
    }
    if (in_RDI->ownNLSstg != 0) {
      SUNNonlinSolFree(in_RDI->NLSstg);
      in_RDI->ownNLSstg = 0;
      in_RDI->NLSstg = (SUNNonlinearSolver)0x0;
    }
    if (in_RDI->ownNLSstg1 != 0) {
      SUNNonlinSolFree(in_RDI->NLSstg1);
      in_RDI->ownNLSstg1 = 0;
      in_RDI->NLSstg1 = (SUNNonlinearSolver)0x0;
    }
    if (in_RDI->cv_atolSmin0 != (int *)0x0) {
      free(in_RDI->cv_atolSmin0);
      in_RDI->cv_atolSmin0 = (int *)0x0;
    }
  }
  return;
}

Assistant:

void CVodeSensFree(void* cvode_mem)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) { return; }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_SensMallocDone)
  {
    if (cv_mem->cv_stgr1alloc)
    {
      free(cv_mem->cv_ncfS1);
      cv_mem->cv_ncfS1 = NULL;
      free(cv_mem->cv_ncfnS1);
      cv_mem->cv_ncfnS1 = NULL;
      free(cv_mem->cv_nniS1);
      cv_mem->cv_nniS1 = NULL;
      free(cv_mem->cv_nnfS1);
      cv_mem->cv_nnfS1      = NULL;
      cv_mem->cv_stgr1alloc = SUNFALSE;
    }
    cvSensFreeVectors(cv_mem);
    cv_mem->cv_SensMallocDone = SUNFALSE;
    cv_mem->cv_sensi          = SUNFALSE;
  }

  /* free any vector wrappers */
  if (cv_mem->simMallocDone)
  {
    N_VDestroy(cv_mem->zn0Sim);
    cv_mem->zn0Sim = NULL;
    N_VDestroy(cv_mem->ycorSim);
    cv_mem->ycorSim = NULL;
    N_VDestroy(cv_mem->ewtSim);
    cv_mem->ewtSim        = NULL;
    cv_mem->simMallocDone = SUNFALSE;
  }
  if (cv_mem->stgMallocDone)
  {
    N_VDestroy(cv_mem->zn0Stg);
    cv_mem->zn0Stg = NULL;
    N_VDestroy(cv_mem->ycorStg);
    cv_mem->ycorStg = NULL;
    N_VDestroy(cv_mem->ewtStg);
    cv_mem->ewtStg        = NULL;
    cv_mem->stgMallocDone = SUNFALSE;
  }

  /* if CVODES created a NLS object then free it */
  if (cv_mem->ownNLSsim)
  {
    SUNNonlinSolFree(cv_mem->NLSsim);
    cv_mem->ownNLSsim = SUNFALSE;
    cv_mem->NLSsim    = NULL;
  }
  if (cv_mem->ownNLSstg)
  {
    SUNNonlinSolFree(cv_mem->NLSstg);
    cv_mem->ownNLSstg = SUNFALSE;
    cv_mem->NLSstg    = NULL;
  }
  if (cv_mem->ownNLSstg1)
  {
    SUNNonlinSolFree(cv_mem->NLSstg1);
    cv_mem->ownNLSstg1 = SUNFALSE;
    cv_mem->NLSstg1    = NULL;
  }

  /* free min atol array if necessary */
  if (cv_mem->cv_atolSmin0)
  {
    free(cv_mem->cv_atolSmin0);
    cv_mem->cv_atolSmin0 = NULL;
  }
}